

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

string * strfmt<char>(string *__return_storage_ptr__,char *format,char *args)

{
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  char *local_20;
  char *args_local;
  char *format_local;
  
  local_20 = args;
  args_local = format;
  format_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  printfmt<char>(local_198,args_local,local_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string strfmt(const char *format, const Args&... args) {
    std::stringstream ss;
    printfmt(ss, format, args...);
    return ss.str();
}